

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressSequences
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t srcSize)

{
  code cVar1;
  ZSTD_sequenceFormat_e ZVar2;
  ulong uVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  ZSTD_compressedBlockState_t *pZVar5;
  short sVar6;
  int iVar7;
  code *pcVar8;
  size_t sVar9;
  code *pcVar10;
  code *pcVar11;
  XXH64_hash_t XVar12;
  code *pcVar13;
  size_t err_code;
  BYTE *op;
  size_t sVar14;
  code *__src;
  code *pcVar15;
  ulong uVar16;
  code *pcVar17;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pcVar8 = (code *)ZSTD_CCtx_init_compressStream2(cctx,ZSTD_e_end,srcSize);
  if (pcVar8 < (code *)0xffffffffffffff89) {
    sVar9 = ZSTD_writeFrameHeader(dst,dstCapacity,&cctx->appliedParams,srcSize,cctx->dictID);
    if ((srcSize != 0) && ((cctx->appliedParams).fParams.checksumFlag != 0)) {
      XXH64_update(&cctx->xxhState,src,srcSize);
    }
    pcVar8 = (code *)((long)dst + sVar9);
    pcVar15 = (code *)(dstCapacity - sVar9);
    local_48 = 0;
    uStack_40 = 0;
    ZVar2 = (cctx->appliedParams).blockDelimiters;
    pcVar13 = (code *)0x0;
    pcVar17 = ZSTD_copySequencesToSeqStoreNoBlockDelim;
    if (ZVar2 != ZSTD_sf_noBlockDelimiters) {
      pcVar17 = pcVar13;
    }
    pcVar10 = ZSTD_copySequencesToSeqStoreExplicitBlockDelim;
    if (ZVar2 != ZSTD_sf_explicitBlockDelimiters) {
      pcVar10 = pcVar17;
    }
    pcVar17 = pcVar15;
    if (srcSize == 0) {
      if (pcVar15 < (code *)0x4) {
        return (size_t)(code *)0xffffffffffffffba;
      }
      *(undefined4 *)pcVar8 = 1;
      pcVar8 = pcVar8 + 3;
      pcVar13 = (code *)0x3;
      pcVar17 = pcVar15 + -3;
    }
    __src = (code *)src;
    for (sVar14 = srcSize; sVar14 != 0; sVar14 = sVar14 - uVar16) {
      uVar3 = cctx->blockSize;
      uVar16 = uVar3;
      if (sVar14 < uVar3) {
        uVar16 = sVar14;
      }
      (cctx->seqStore).lit = (cctx->seqStore).litStart;
      (cctx->seqStore).sequences = (cctx->seqStore).sequencesStart;
      (cctx->seqStore).longLengthType = ZSTD_llt_none;
      iVar7 = 0x5a69ab;
      pcVar11 = (code *)(*pcVar10)(cctx,&local_48,inSeqs,inSeqsSize,__src,uVar16 & 0xffffffff);
      if ((code *)0xffffffffffffff88 < pcVar11) {
        return (size_t)pcVar11;
      }
      uVar16 = (uVar16 & 0xffffffff) - (long)pcVar11;
      sVar6 = (short)uVar16;
      if (uVar16 < 7) {
        pcVar11 = (code *)(uVar16 + 3);
        if (pcVar17 < pcVar11) {
          return (size_t)(code *)0xffffffffffffffba;
        }
        *(ushort *)pcVar8 = (ushort)(sVar14 <= uVar3) + sVar6 * 8;
        pcVar8[2] = (code)0x0;
        memcpy(pcVar8 + 3,__src,uVar16);
        pcVar13 = pcVar13 + (long)pcVar11;
      }
      else {
        pcVar11 = (code *)ZSTD_entropyCompressSeqStore
                                    (&cctx->seqStore,&((cctx->blockState).prevCBlock)->entropy,
                                     &((cctx->blockState).nextCBlock)->entropy,&cctx->appliedParams,
                                     pcVar8 + 3,(size_t)(pcVar17 + -3),uVar16,cctx->entropyWorkspace
                                     ,(ulong)(uint)cctx->bmi2,iVar7);
        if ((code *)0xffffffffffffff88 < pcVar11) {
          return (size_t)pcVar11;
        }
        if ((((cctx->isFirstBlock == 0) && (iVar7 = ZSTD_maybeRLE(&cctx->seqStore), iVar7 != 0)) &&
            (iVar7 = ZSTD_isRLE((BYTE *)src,srcSize), iVar7 != 0)) ||
           (pcVar11 == (code *)&DAT_00000001)) {
          if (pcVar17 < (code *)0x4) {
            return (size_t)(code *)0xffffffffffffffba;
          }
          cVar1 = *__src;
          *(ushort *)pcVar8 = (ushort)(sVar14 <= uVar3) + sVar6 * 8 + 2;
          pcVar8[2] = SUB81(uVar16 >> 0xd,0);
          pcVar8[3] = cVar1;
          pcVar11 = (code *)0x4;
        }
        else if (pcVar11 == (code *)0x0) {
          pcVar11 = (code *)(uVar16 + 3);
          if (pcVar17 < pcVar11) {
            return (size_t)(code *)0xffffffffffffffba;
          }
          *(ushort *)pcVar8 = (ushort)(sVar14 <= uVar3) + sVar6 * 8;
          pcVar8[2] = SUB81(uVar16 >> 0xd,0);
          memcpy(pcVar8 + 3,__src,uVar16);
          if ((code *)0xffffffffffffff88 < pcVar11) {
            return (size_t)pcVar11;
          }
        }
        else {
          pZVar4 = (cctx->blockState).prevCBlock;
          pZVar5 = (cctx->blockState).nextCBlock;
          (cctx->blockState).prevCBlock = pZVar5;
          (cctx->blockState).nextCBlock = pZVar4;
          if ((pZVar5->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
            (pZVar5->entropy).fse.offcode_repeatMode = FSE_repeat_check;
          }
          *(ushort *)pcVar8 = (ushort)(sVar14 <= uVar3) + (short)pcVar11 * 8 + 4;
          pcVar8[2] = SUB81((ulong)pcVar11 >> 0xd,0);
          pcVar11 = pcVar11 + 3;
        }
        pcVar13 = pcVar13 + (long)pcVar11;
        if (sVar14 <= uVar3) break;
        cctx->isFirstBlock = 0;
      }
      pcVar17 = pcVar17 + -(long)pcVar11;
      __src = __src + uVar16;
      pcVar8 = pcVar8 + (long)pcVar11;
    }
    pcVar8 = pcVar13;
    if ((pcVar13 < (code *)0xffffffffffffff89) &&
       (pcVar8 = pcVar13 + sVar9, (cctx->appliedParams).fParams.checksumFlag != 0)) {
      XVar12 = XXH64_digest(&cctx->xxhState);
      if ((ulong)((long)pcVar15 - (long)pcVar13) < 4) {
        pcVar8 = (code *)0xffffffffffffffba;
      }
      else {
        *(int *)((long)dst + (long)pcVar8) = (int)XVar12;
        pcVar8 = pcVar8 + 4;
      }
    }
  }
  return (size_t)pcVar8;
}

Assistant:

size_t ZSTD_compressSequences(ZSTD_CCtx* const cctx, void* dst, size_t dstCapacity,
                              const ZSTD_Sequence* inSeqs, size_t inSeqsSize,
                              const void* src, size_t srcSize) {
    BYTE* op = (BYTE*)dst;
    size_t cSize = 0;
    size_t compressedBlocksSize = 0;
    size_t frameHeaderSize = 0;

    /* Transparent initialization stage, same as compressStream2() */
    DEBUGLOG(3, "ZSTD_compressSequences()");
    assert(cctx != NULL);
    FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, ZSTD_e_end, srcSize), "CCtx initialization failed");
    /* Begin writing output, starting with frame header */
    frameHeaderSize = ZSTD_writeFrameHeader(op, dstCapacity, &cctx->appliedParams, srcSize, cctx->dictID);
    op += frameHeaderSize;
    dstCapacity -= frameHeaderSize;
    cSize += frameHeaderSize;
    if (cctx->appliedParams.fParams.checksumFlag && srcSize) {
        XXH64_update(&cctx->xxhState, src, srcSize);
    }
    /* cSize includes block header size and compressed sequences size */
    compressedBlocksSize = ZSTD_compressSequences_internal(cctx,
                                                           op, dstCapacity,
                                                           inSeqs, inSeqsSize,
                                                           src, srcSize);
    FORWARD_IF_ERROR(compressedBlocksSize, "Compressing blocks failed!");
    cSize += compressedBlocksSize;
    dstCapacity -= compressedBlocksSize;

    if (cctx->appliedParams.fParams.checksumFlag) {
        U32 const checksum = (U32) XXH64_digest(&cctx->xxhState);
        RETURN_ERROR_IF(dstCapacity<4, dstSize_tooSmall, "no room for checksum");
        DEBUGLOG(4, "Write checksum : %08X", (unsigned)checksum);
        MEM_writeLE32((char*)dst + cSize, checksum);
        cSize += 4;
    }

    DEBUGLOG(3, "Final compressed size: %zu", cSize);
    return cSize;
}